

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polycurve.cpp
# Opt level: O0

bool __thiscall ON_PolyCurve::Insert(ON_PolyCurve *this,int segment_index,ON_Curve *c)

{
  double dVar1;
  bool bVar2;
  byte bVar3;
  int iVar4;
  int iVar5;
  double *pdVar6;
  double local_90;
  double local_88;
  double local_80;
  int local_5c;
  int i;
  double *t;
  double dt;
  double t1;
  double t0;
  int count;
  bool rc;
  double s1;
  double s0;
  ON_Curve *c_local;
  ON_PolyCurve *pOStack_10;
  int segment_index_local;
  ON_PolyCurve *this_local;
  
  t0._7_1_ = 0;
  s0 = (double)c;
  c_local._4_4_ = segment_index;
  pOStack_10 = this;
  t0._0_4_ = Count(this);
  if ((((-1 < c_local._4_4_) && (c_local._4_4_ <= t0._0_4_)) && (s0 != 0.0)) &&
     (((ON_PolyCurve *)s0 != this &&
      (bVar2 = ON_Curve::GetDomain((ON_Curve *)s0,&s1,(double *)&count), bVar2)))) {
    t0._7_1_ = 1;
    if (0 < t0._0_4_) {
      iVar4 = (**(code **)(*(long *)s0 + 0xc0))();
      iVar5 = (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x18])();
      dVar1 = s0;
      if (iVar4 != iVar5) {
        iVar4 = (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x18])();
        bVar3 = (**(code **)(*(long *)dVar1 + 0x140))(dVar1,iVar4);
        t0._7_1_ = bVar3 & 1;
      }
    }
    if ((t0._7_1_ & 1) != 0) {
      ON_SimpleArray<ON_Curve_*>::Insert
                (&(this->m_segment).super_ON_SimpleArray<ON_Curve_*>,c_local._4_4_,(ON_Curve **)&s0)
      ;
      if (c_local._4_4_ == t0._0_4_) {
        if (t0._0_4_ == 0) {
          ON_SimpleArray<double>::Append(&this->m_t,&s1);
          ON_SimpleArray<double>::Append(&this->m_t,(double *)&count);
        }
        else {
          pdVar6 = ON_SimpleArray<double>::operator[](&this->m_t,t0._0_4_);
          t1 = *pdVar6;
          if ((s1 != t1) || (NAN(s1) || NAN(t1))) {
            local_80 = (_count - s1) + t1;
          }
          else {
            local_80 = _count;
          }
          dt = local_80;
          ON_SimpleArray<double>::Append(&this->m_t,&dt);
        }
      }
      else if (c_local._4_4_ == 0) {
        pdVar6 = ON_SimpleArray<double>::operator[](&this->m_t,0);
        dt = *pdVar6;
        if ((_count != dt) || (NAN(_count) || NAN(dt))) {
          local_88 = (s1 - _count) + dt;
        }
        else {
          local_88 = s1;
        }
        t1 = local_88;
        ON_SimpleArray<double>::Insert(&this->m_t,0,&t1);
      }
      else {
        pdVar6 = ON_SimpleArray<double>::operator[](&this->m_t,c_local._4_4_);
        t1 = *pdVar6;
        if ((s1 != t1) || (NAN(s1) || NAN(t1))) {
          local_90 = (_count - s1) + t1;
        }
        else {
          local_90 = _count;
        }
        dt = local_90;
        local_90 = local_90 - t1;
        ON_SimpleArray<double>::Insert(&this->m_t,c_local._4_4_ + 1,&dt);
        pdVar6 = ON_SimpleArray<double>::Array(&this->m_t);
        for (local_5c = c_local._4_4_ + 2; local_5c <= t0._0_4_ + 1; local_5c = local_5c + 1) {
          pdVar6[local_5c] = local_90 + pdVar6[local_5c];
        }
      }
    }
  }
  return (bool)(t0._7_1_ & 1);
}

Assistant:

bool ON_PolyCurve::Insert( int segment_index, ON_Curve* c )
{
  double s0, s1;
  bool rc = false;
  const int count = Count();
  if ( segment_index >= 0 && segment_index <= count && c && c != this && 
		c->GetDomain(&s0,&s1) ) 
  {
		rc = true;
		if (count > 0 && c->Dimension() != Dimension())			// 1-Sept-2017 (GBA)  Dimensions must agree
		{
			rc = c->ChangeDimension(Dimension());									// If not change the dimension of *c to match
		}

		if (rc)
		{
			m_segment.Insert(segment_index, c);

			// determine polycurve parameters for this segment
			double t0, t1;
			if (segment_index == count) {
				// append segment
				if (count == 0) {
					m_t.Append(s0);
					m_t.Append(s1);
				}
				else {
					t0 = m_t[count];
					t1 = (s0 == t0) ? s1 : (s1 - s0 + t0);
					m_t.Append(t1);
				}
			}
			else if (segment_index == 0) {
				// prepend segment
				t1 = m_t[0];
				t0 = (s1 == t1) ? s0 : (s0 - s1 + t1);
				m_t.Insert(0, t0);
			}
			else {
				// insert segment
				t0 = m_t[segment_index];
				t1 = (s0 == t0) ? s1 : (s1 - s0 + t0);
				const double dt = t1 - t0;
				m_t.Insert(segment_index + 1, t1);
				double* t = m_t.Array();
				for (int i = segment_index + 2; i <= count + 1; i++) {
					t[i] += dt;
				}
			}
		}
  }
  return rc;
}